

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

void write_zip(char *zipname,dir_tree_t *trees,int update)

{
  dir_tree_s **ppdVar1;
  int iVar2;
  dir_tree_s *pdVar3;
  file_sorted_t *__ptr;
  BYTE *odir;
  FILE *__stream;
  long lVar4;
  size_t sVar5;
  file_entry_t *pfVar6;
  file_sorted_t *pfVar7;
  uint num_files;
  ulong uVar8;
  ulong uVar9;
  EndOfCentralDirectory dirend;
  char tempname [4096];
  FILE *local_1060;
  undefined8 local_1050;
  undefined2 local_1048;
  undefined2 local_1046;
  int local_1044;
  int local_1040;
  undefined2 local_103c;
  char local_1038 [4104];
  
  num_files = 0;
  pdVar3 = trees;
  if (trees != (dir_tree_t *)0x0) {
    do {
      pfVar6 = (file_entry_t *)&pdVar3->files;
      num_files = num_files - 1;
      do {
        pfVar6 = pfVar6->next;
        num_files = num_files + 1;
      } while (pfVar6 != (file_entry_t *)0x0);
      ppdVar1 = &pdVar3->next;
      pdVar3 = *ppdVar1;
    } while (*ppdVar1 != (dir_tree_s *)0x0);
  }
  __ptr = sort_files(trees,num_files);
  if (__ptr == (file_sorted_t *)0x0) {
    no_mem = 1;
    return;
  }
  if (update == 0) {
    local_1060 = (FILE *)0x0;
LAB_00103a6d:
    __stream = fopen(zipname,"wb");
    odir = (BYTE *)0x0;
  }
  else {
    sprintf(local_1038,"%s.temp",zipname);
    local_1060 = fopen(zipname,"rb");
    if (local_1060 == (FILE *)0x0) {
      write_zip_cold_1();
LAB_00103c1a:
      write_zip_cold_2();
      goto LAB_00103a6d;
    }
    odir = find_central_dir((FILE *)local_1060);
    if (odir == (BYTE *)0x0) {
      fprintf(_stderr,"Could not read central directory from %s. (Is it a zipfile?)\n",zipname);
      goto LAB_00103c1a;
    }
    __stream = fopen(local_1038,"wb");
  }
  if (__stream == (FILE *)0x0) {
    write_zip_cold_6();
LAB_00103bb4:
    free(__ptr);
    if (local_1060 != (FILE *)0x0) {
      fclose(local_1060);
    }
  }
  else {
    uVar9 = (ulong)num_files;
    uVar8 = 0;
    pfVar7 = __ptr;
    if ((int)num_files < 1) {
LAB_00103ac3:
      if ((uint)uVar8 != num_files) goto LAB_00103bb4;
    }
    else {
      do {
        iVar2 = append_to_zip((FILE *)__stream,pfVar7,(FILE *)local_1060,odir);
        if (iVar2 != 0) goto LAB_00103ac3;
        uVar8 = uVar8 + 1;
        pfVar7 = pfVar7 + 1;
      } while (uVar9 != uVar8);
    }
    lVar4 = ftell(__stream);
    iVar2 = (int)lVar4;
    pfVar7 = __ptr;
    local_1040 = iVar2;
    if ((int)num_files < 1) {
      local_1048 = 0;
    }
    else {
      do {
        write_central_dir((FILE *)__stream,pfVar7);
        uVar9 = uVar9 - 1;
        pfVar7 = pfVar7 + 1;
      } while (uVar9 != 0);
      local_1048 = (undefined2)num_files;
    }
    local_1050 = 0x6054b50;
    local_1046 = local_1048;
    lVar4 = ftell(__stream);
    local_1044 = (int)lVar4 - iVar2;
    local_103c = 0;
    sVar5 = fwrite(&local_1050,0x16,1,__stream);
    if (sVar5 != 1) {
      write_zip_cold_3();
    }
    printf("%s contains %d files (updated %d)\n",zipname,(ulong)num_files,(ulong)(uint)UpdateCount);
    fclose(__stream);
    if (local_1060 != (FILE *)0x0) {
      fclose(local_1060);
      iVar2 = remove(zipname);
      if (iVar2 == 0) {
        iVar2 = rename(local_1038,zipname);
        if (iVar2 != 0) {
          write_zip_cold_5();
        }
      }
      else {
        write_zip_cold_4();
      }
    }
    free(__ptr);
  }
  if (odir != (BYTE *)0x0) {
    free(odir);
  }
  return;
}

Assistant:

void write_zip(const char *zipname, dir_tree_t *trees, int update)
{
#ifdef _WIN32
	char tempname[_MAX_PATH];
#else
	char tempname[PATH_MAX];
#endif
	EndOfCentralDirectory dirend;
	int i, num_files;
	file_sorted_t *sorted;
	FILE *zip, *ozip = NULL;
	void *central_dir = NULL;

	num_files = count_files(trees);
	sorted = sort_files(trees, num_files);
	if (sorted == NULL)
	{
		no_mem = 1;
		return;
	}
	if (update)
	{
		sprintf(tempname, "%s.temp", zipname);
		ozip = fopen(zipname, "rb");
		if (ozip == NULL)
		{
			fprintf(stderr, "Could not open %s for updating: %s\n", zipname, strerror(errno));
			update = 0;
		}
		else
		{
			central_dir = find_central_dir(ozip);
			if (central_dir == NULL)
			{
				fprintf(stderr, "Could not read central directory from %s. (Is it a zipfile?)\n", zipname);
				update = 0;
			}
		}
		if (!update)
		{
			fprintf(stderr, "Will proceed as if -u had not been specified.\n");
		}
	}
	if (update)
	{
		zip = fopen(tempname, "wb");
	}
	else
	{
		zip = fopen(zipname, "wb");
	}
	if (zip == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", zipname, strerror(errno));
	}
	else
	{
		// Write each file.
		for (i = 0; i < num_files; ++i)
		{
			if (append_to_zip(zip, sorted + i, ozip, central_dir))
			{
				break;
			}
		}
		if (i == num_files)
		{
			// Write central directory.
			dirend.DirectoryOffset = LittleLong(ftell(zip));
			for (i = 0; i < num_files; ++i)
			{
				write_central_dir(zip, sorted + i);
			}
			// Write the directory terminator.
			dirend.Magic = ZIP_ENDOFDIR;
			dirend.DiskNumber = 0;
			dirend.FirstDisk = 0;
			dirend.NumEntriesOnAllDisks = dirend.NumEntries = LittleShort(i);
			// In this case LittleLong(dirend.DirectoryOffset) is undoing the transformation done above.
			dirend.DirectorySize = LittleLong(ftell(zip) - LittleLong(dirend.DirectoryOffset));
			dirend.ZipCommentLength = 0;
			if (fwrite(&dirend, sizeof(dirend), 1, zip) != 1)
			{
				fprintf(stderr, "Failed writing zip directory terminator: %s\n", strerror(errno));
			}
			printf("%s contains %d files (updated %d)\n", zipname, num_files, UpdateCount);
			fclose(zip);

			if (ozip != NULL)
			{
				// Delete original, and rename temp to take its place
				fclose(ozip);
				ozip = NULL;
				if (remove(zipname))
				{
					fprintf(stderr, "Could not delete old zip: %s\nUpdated zip can be found at %s\n",
						strerror(errno), tempname);
				}
				else if (rename(tempname, zipname))
				{
					fprintf(stderr, "Could not rename %s to %s: %s\n",
						tempname, zipname, strerror(errno));
				}
			}
		}
	}
	free(sorted);
	if (ozip != NULL)
	{
		fclose(ozip);
	}
	if (central_dir != NULL)
	{
		free(central_dir);
	}
}